

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<2,_151>::BreitWignerReichMooreLValueBase::verifySize
               (int NPL,int NRS)

{
  undefined8 *puVar1;
  char *args;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>("Encountered empty list");
    args = "NPL should be larger than zero and equal to 6 * NRS";
  }
  else {
    if (NRS < 1) {
      tools::Log::error<char_const*>("Encountered illegal NRS value");
      tools::Log::info<char_const*>("NRS should be larger than zero");
      goto LAB_00136699;
    }
    if (NRS * 6 == NPL) {
      return;
    }
    tools::Log::error<char_const*>("Encountered inconsistent list size");
    args = "NPL must be equal to 6 * NRS";
  }
  tools::Log::info<char_const*>(args);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
LAB_00136699:
  tools::Log::info<char_const*,int>("NRS value: {}",NRS);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NRS ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to 6 * NRS" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NRS value: {}", NRS );
    throw std::exception();
  }

  if ( NRS < 1 ) {

    Log::error( "Encountered illegal NRS value" );
    Log::info( "NRS should be larger than zero" );
    Log::info( "NRS value: {}", NRS );
    throw std::exception();
  }

  if ( NPL != 6 * NRS ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to 6 * NRS" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NRS value: {}", NRS );
    throw std::exception();
  }
}